

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFFLoader.cpp
# Opt level: O1

void __thiscall
Assimp::NFFImporter::LoadNFF2MaterialTable
          (NFFImporter *this,
          vector<Assimp::NFFImporter::ShadingInfo,_std::allocator<Assimp::NFFImporter::ShadingInfo>_>
          *output,string *path,IOSystem *pIOHandler)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  Assimp AVar4;
  bool bVar5;
  vector<Assimp::NFFImporter::ShadingInfo,_std::allocator<Assimp::NFFImporter::ShadingInfo>_>
  *pvVar6;
  int iVar7;
  undefined4 extraout_var;
  long *plVar8;
  Logger *pLVar9;
  ostream *poVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  long *plVar13;
  Assimp *pAVar14;
  Assimp *pAVar15;
  Assimp *pAVar16;
  ulong uVar17;
  byte *__s2;
  long lVar18;
  vector<char,_std::allocator<char>_> mBuffer2;
  aiColor3D c;
  char line [4096];
  Assimp *local_1240;
  IOStream *local_1238;
  pointer local_1230;
  allocator<char> local_1221;
  long *local_1220;
  long local_1210 [2];
  vector<char,_std::allocator<char>_> local_1200;
  long *local_11e8;
  long local_11e0;
  long local_11d8 [2];
  vector<Assimp::NFFImporter::ShadingInfo,_std::allocator<Assimp::NFFImporter::ShadingInfo>_>
  *local_11c8;
  float *local_11c0;
  float *local_11b8;
  undefined1 local_11b0 [32];
  ai_real local_1190;
  undefined1 local_118c [16];
  undefined8 local_117c;
  float local_1174;
  _Alloc_hider local_1170;
  size_type local_1168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1160;
  undefined2 local_1150;
  undefined8 local_114c;
  _Alloc_hider local_1140;
  size_type local_1138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1130;
  aiTextureMapping local_1120;
  undefined1 local_1038 [7];
  Assimp AStack_1031;
  long local_1030;
  long local_1028;
  long lStack_1020;
  ios_base local_fc8 [3992];
  IOStream *stream;
  
  _local_1038 = &local_1028;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1038,"rb","");
  iVar7 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(path->_M_dataplus)._M_p,_local_1038);
  stream = (IOStream *)CONCAT44(extraout_var,iVar7);
  if (_local_1038 != &local_1028) {
    operator_delete(_local_1038,local_1028 + 1);
  }
  if (stream == (IOStream *)0x0) {
    pLVar9 = DefaultLogger::get();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_11b0,
                   "NFF2: Unable to open material library ",path);
    plVar8 = (long *)std::__cxx11::string::append(local_11b0);
    plVar13 = plVar8 + 2;
    if ((long *)*plVar8 == plVar13) {
      local_1028 = *plVar13;
      lStack_1020 = plVar8[3];
      _local_1038 = &local_1028;
    }
    else {
      local_1028 = *plVar13;
      _local_1038 = (long *)*plVar8;
    }
    local_1030 = plVar8[1];
    *plVar8 = (long)plVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    Logger::error(pLVar9,(char *)_local_1038);
    if (_local_1038 != &local_1028) {
      operator_delete(_local_1038,local_1028 + 1);
    }
    if ((undefined1 *)local_11b0._0_8_ == local_11b0 + 0x10) goto LAB_0049bebd;
    uVar17 = local_11b0._16_8_ + 1;
    local_1200.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_11b0._0_8_;
  }
  else {
    iVar7 = (*stream->_vptr_IOStream[6])(stream);
    std::vector<char,_std::allocator<char>_>::vector
              (&local_1200,(ulong)(iVar7 + 1),(allocator_type *)local_1038);
    BaseImporter::TextFileToBuffer(stream,&local_1200,FORBID_EMPTY);
    __s2 = (byte *)local_1200.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    CommentRemover::RemoveLineComments
              ("//",local_1200.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,' ');
    iVar7 = strncmp("mat",(char *)__s2,3);
    if (iVar7 == 0) {
      bVar2 = ((pointer)__s2)[3];
      bVar5 = false;
      if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
        pbVar1 = (byte *)((pointer)__s2 + 3);
        __s2 = (byte *)((pointer)__s2 + 4);
        if (bVar2 == 0) {
          __s2 = pbVar1;
        }
        bVar5 = true;
      }
    }
    else {
      bVar5 = false;
    }
    pvVar6 = output;
    if (bVar5) {
LAB_0049b17e:
      local_11c8 = pvVar6;
      local_1238 = stream;
      local_1230 = (pointer)0x0;
LAB_0049b180:
      local_11b8 = &local_1230->shininess;
      local_11c0 = &local_1230->opacity;
LAB_0049b19d:
      do {
        bVar2 = *__s2;
        if (bVar2 != 0) {
          for (uVar17 = 0;
              (bVar3 = __s2[uVar17], (bVar3 < 0xe & (byte)(0x3401 >> (bVar3 & 0x1f))) == 0 &&
              (uVar17 < 0x1000)); uVar17 = uVar17 + 1) {
            local_1038[uVar17] = bVar3;
          }
          local_1038[uVar17] = 0;
          __s2 = __s2 + uVar17;
          while ((*__s2 < 0xe && ((0x3400U >> (*__s2 & 0x1f) & 1) != 0))) {
            __s2 = __s2 + 1;
          }
        }
        stream = local_1238;
        if (bVar2 == 0) goto LAB_0049be38;
        for (lVar18 = 0; (local_1038[lVar18] == ' ' || (local_1038[lVar18] == '\t'));
            lVar18 = lVar18 + 1) {
        }
        pAVar16 = (Assimp *)(local_1038 + lVar18);
        local_1240 = pAVar16;
        iVar7 = strncmp("version",(char *)pAVar16,7);
        if (iVar7 == 0) {
          bVar2 = local_1038[lVar18 + 7];
          if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
            local_1240 = (Assimp *)((long)&local_1030 + (lVar18 - (ulong)(bVar2 == 0)));
            pLVar9 = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[44]>
                      ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_11b0,(char (*) [44])"NFF (Sense8) material library file format: ");
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_11e8,(char *)local_1240,&local_1221);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_11b0,(char *)local_11e8,local_11e0);
            std::__cxx11::stringbuf::str();
            Logger::info(pLVar9,(char *)local_1220);
            if (local_1220 != local_1210) {
              operator_delete(local_1220,local_1210[0] + 1);
            }
            if (local_11e8 != local_11d8) {
              operator_delete(local_11e8,local_11d8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_11b0);
            std::ios_base::~ios_base((ios_base *)&local_1140);
            goto LAB_0049b19d;
          }
        }
        iVar7 = strncmp("matdef",(char *)pAVar16,6);
        pvVar6 = local_11c8;
        if (iVar7 == 0) {
          bVar2 = local_1038[lVar18 + 6];
          if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0))
          goto LAB_0049bbaf;
        }
        iVar7 = strncmp("valid",(char *)pAVar16,5);
        if (iVar7 == 0) {
          bVar2 = local_1038[lVar18 + 5];
          if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
            local_1240 = (Assimp *)(local_1038 + (lVar18 - (ulong)(bVar2 == 0)) + 6);
            goto LAB_0049b19d;
          }
        }
        if ((0xd < (byte)*pAVar16) || ((0x3401U >> ((byte)*pAVar16 & 0x1f) & 1) == 0)) {
          if (local_1230 == (pointer)0x0) {
            local_1230 = (pointer)DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[38]>
                      ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_11b0,(char (*) [38])"NFF2 material library: Found element ");
            poVar10 = (ostream *)
                      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                      operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *
                                )local_11b0,(char **)&local_1240);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,"but there is no active material",0x1f);
            std::__cxx11::stringbuf::str();
            Logger::error((Logger *)local_1230,(char *)local_1220);
            if (local_1220 != local_1210) {
              operator_delete(local_1220,local_1210[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_11b0);
            std::ios_base::~ios_base((ios_base *)&local_1140);
            stream = local_1238;
            pvVar6 = local_11c8;
            goto LAB_0049b17e;
          }
          local_11b0._0_8_ = (byte *)0x0;
          local_11b0._8_8_ = local_11b0._8_8_ & 0xffffffff00000000;
          iVar7 = strncmp("ambient",(char *)pAVar16,7);
          pAVar16 = local_1240;
          if (iVar7 == 0) {
            bVar2 = local_1038[lVar18 + 7];
            if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
              pAVar15 = (Assimp *)(local_1038 + lVar18 + 7);
              pAVar16 = (Assimp *)((long)&local_1030 + lVar18);
              if (bVar2 == 0) {
                pAVar16 = pAVar15;
              }
              for (; (*pAVar16 == (Assimp)0x20 || (*pAVar16 == (Assimp)0x9)); pAVar16 = pAVar16 + 1)
              {
              }
              if ((byte)*pAVar16 < 0xe) {
                pAVar15 = (Assimp *)0x3401;
                uVar12 = 1;
                if ((0x3401U >> ((byte)*pAVar16 & 0x1f) & 1) == 0) goto LAB_0049ba0a;
              }
              else {
LAB_0049ba0a:
                uVar12 = SUB81(pAVar15,0);
                local_1240 = pAVar16;
                pAVar16 = (Assimp *)
                          fast_atoreal_move<float>(pAVar16,local_11b0,(float *)0x1,(bool)uVar12);
              }
              for (; (*pAVar16 == (Assimp)0x20 || (*pAVar16 == (Assimp)0x9)); pAVar16 = pAVar16 + 1)
              {
              }
              if ((byte)*pAVar16 < 0xe) {
                uVar12 = true;
                uVar11 = 1;
                if ((0x3401U >> ((byte)*pAVar16 & 0x1f) & 1) == 0) goto LAB_0049ba1e;
              }
              else {
LAB_0049ba1e:
                local_1240 = pAVar16;
                pAVar16 = (Assimp *)
                          fast_atoreal_move<float>(pAVar16,local_11b0 + 4,(float *)0x1,(bool)uVar12)
                ;
                uVar11 = uVar12;
              }
              for (; (*pAVar16 == (Assimp)0x20 || (*pAVar16 == (Assimp)0x9)); pAVar16 = pAVar16 + 1)
              {
              }
              local_1240 = pAVar16;
              if ((0xd < (byte)*pAVar16) ||
                 (uVar11 = true, (0x3401U >> ((byte)*pAVar16 & 0x1f) & 1) == 0)) {
                local_1240 = (Assimp *)
                             fast_atoreal_move<float>
                                       (pAVar16,local_11b0 + 8,(float *)0x1,(bool)uVar11);
              }
              (local_1230->ambient).r = (ai_real)local_11b0._0_4_;
              (local_1230->ambient).g = (ai_real)local_11b0._4_4_;
              (local_1230->ambient).b = (ai_real)local_11b0._8_4_;
              goto LAB_0049b19d;
            }
          }
          iVar7 = strncmp("diffuse",(char *)local_1240,7);
          pAVar15 = local_1240;
          if (iVar7 != 0) {
LAB_0049b345:
            iVar7 = strncmp("ambientdiffuse",(char *)local_1240,0xe);
            pAVar16 = local_1240;
            if (iVar7 == 0) {
              AVar4 = pAVar15[0xe];
              if (((ulong)(byte)AVar4 < 0x21) &&
                 ((0x100003601U >> ((ulong)(byte)AVar4 & 0x3f) & 1) != 0)) {
                pAVar14 = pAVar15 + 0xe;
                pAVar16 = pAVar15 + 0xf;
                if (AVar4 == (Assimp)0x0) {
                  pAVar16 = pAVar14;
                }
                goto LAB_0049b6bf;
              }
            }
            iVar7 = strncmp("specular",(char *)local_1240,8);
            pAVar15 = local_1240;
            if (iVar7 == 0) {
              AVar4 = pAVar16[8];
              if (((ulong)(byte)AVar4 < 0x21) &&
                 ((0x100003601U >> ((ulong)(byte)AVar4 & 0x3f) & 1) != 0)) {
                pAVar15 = pAVar16 + 8;
                pAVar16 = pAVar16 + 9;
                if (AVar4 == (Assimp)0x0) {
                  pAVar16 = pAVar15;
                }
                for (; (*pAVar16 == (Assimp)0x20 || (*pAVar16 == (Assimp)0x9));
                    pAVar16 = pAVar16 + 1) {
                }
                if ((byte)*pAVar16 < 0xe) {
                  pAVar15 = (Assimp *)0x3401;
                  uVar12 = 1;
                  if ((0x3401U >> ((byte)*pAVar16 & 0x1f) & 1) == 0) goto LAB_0049bb0b;
                }
                else {
LAB_0049bb0b:
                  uVar12 = SUB81(pAVar15,0);
                  local_1240 = pAVar16;
                  pAVar16 = (Assimp *)
                            fast_atoreal_move<float>(pAVar16,local_11b0,(float *)0x1,(bool)uVar12);
                }
                for (; (*pAVar16 == (Assimp)0x20 || (*pAVar16 == (Assimp)0x9));
                    pAVar16 = pAVar16 + 1) {
                }
                if ((byte)*pAVar16 < 0xe) {
                  uVar12 = true;
                  uVar11 = 1;
                  if ((0x3401U >> ((byte)*pAVar16 & 0x1f) & 1) == 0) goto LAB_0049bb25;
                }
                else {
LAB_0049bb25:
                  local_1240 = pAVar16;
                  pAVar16 = (Assimp *)
                            fast_atoreal_move<float>
                                      (pAVar16,local_11b0 + 4,(float *)0x1,(bool)uVar12);
                  uVar11 = uVar12;
                }
                for (; (*pAVar16 == (Assimp)0x20 || (*pAVar16 == (Assimp)0x9));
                    pAVar16 = pAVar16 + 1) {
                }
                local_1240 = pAVar16;
                if ((0xd < (byte)*pAVar16) ||
                   (uVar11 = true, (0x3401U >> ((byte)*pAVar16 & 0x1f) & 1) == 0)) {
                  local_1240 = (Assimp *)
                               fast_atoreal_move<float>
                                         (pAVar16,local_11b0 + 8,(float *)0x1,(bool)uVar11);
                }
                (local_1230->specular).r = (ai_real)local_11b0._0_4_;
                (local_1230->specular).g = (ai_real)local_11b0._4_4_;
                (local_1230->specular).b = (ai_real)local_11b0._8_4_;
                goto LAB_0049b19d;
              }
            }
            iVar7 = strncmp("emission",(char *)local_1240,8);
            pAVar16 = local_1240;
            if (iVar7 == 0) {
              AVar4 = pAVar15[8];
              if (((ulong)(byte)AVar4 < 0x21) &&
                 ((0x100003601U >> ((ulong)(byte)AVar4 & 0x3f) & 1) != 0)) {
                pAVar16 = pAVar15 + 8;
                pAVar15 = pAVar15 + 9;
                if (AVar4 == (Assimp)0x0) {
                  pAVar15 = pAVar16;
                }
                for (; (*pAVar15 == (Assimp)0x20 || (*pAVar15 == (Assimp)0x9));
                    pAVar15 = pAVar15 + 1) {
                }
                if ((byte)*pAVar15 < 0xe) {
                  pAVar16 = (Assimp *)0x3401;
                  uVar12 = 1;
                  if ((0x3401U >> ((byte)*pAVar15 & 0x1f) & 1) == 0) goto LAB_0049bb5d;
                }
                else {
LAB_0049bb5d:
                  uVar12 = SUB81(pAVar16,0);
                  local_1240 = pAVar15;
                  pAVar15 = (Assimp *)
                            fast_atoreal_move<float>(pAVar15,local_11b0,(float *)0x1,(bool)uVar12);
                }
                for (; (*pAVar15 == (Assimp)0x20 || (*pAVar15 == (Assimp)0x9));
                    pAVar15 = pAVar15 + 1) {
                }
                if ((byte)*pAVar15 < 0xe) {
                  uVar12 = true;
                  uVar11 = 1;
                  if ((0x3401U >> ((byte)*pAVar15 & 0x1f) & 1) == 0) goto LAB_0049bb77;
                }
                else {
LAB_0049bb77:
                  local_1240 = pAVar15;
                  pAVar15 = (Assimp *)
                            fast_atoreal_move<float>
                                      (pAVar15,local_11b0 + 4,(float *)0x1,(bool)uVar12);
                  uVar11 = uVar12;
                }
                for (; (*pAVar15 == (Assimp)0x20 || (*pAVar15 == (Assimp)0x9));
                    pAVar15 = pAVar15 + 1) {
                }
                local_1240 = pAVar15;
                if ((0xd < (byte)*pAVar15) ||
                   (uVar11 = true, (0x3401U >> ((byte)*pAVar15 & 0x1f) & 1) == 0)) {
                  local_1240 = (Assimp *)
                               fast_atoreal_move<float>
                                         (pAVar15,local_11b0 + 8,(float *)0x1,(bool)uVar11);
                }
                (local_1230->emissive).r = (ai_real)local_11b0._0_4_;
                (local_1230->emissive).g = (ai_real)local_11b0._4_4_;
                (local_1230->emissive).b = (ai_real)local_11b0._8_4_;
                goto LAB_0049b19d;
              }
            }
            iVar7 = strncmp("shininess",(char *)local_1240,9);
            pAVar15 = local_1240;
            if (iVar7 == 0) {
              AVar4 = pAVar16[9];
              if (((ulong)(byte)AVar4 < 0x21) &&
                 ((0x100003601U >> ((ulong)(byte)AVar4 & 0x3f) & 1) != 0)) {
                pAVar15 = pAVar16 + 9;
                local_1240 = pAVar16 + 10;
                if (AVar4 == (Assimp)0x0) {
                  local_1240 = pAVar15;
                }
                for (; (*local_1240 == (Assimp)0x20 || (*local_1240 == (Assimp)0x9));
                    local_1240 = local_1240 + 1) {
                }
                if ((0xd < (byte)*local_1240) ||
                   (pAVar15 = (Assimp *)0x3401, (0x3401U >> ((byte)*local_1240 & 0x1f) & 1) == 0)) {
                  local_1240 = (Assimp *)
                               fast_atoreal_move<float>
                                         (local_1240,(char *)local_11b8,(float *)0x1,
                                          SUB81(pAVar15,0));
                }
                goto LAB_0049b19d;
              }
            }
            iVar7 = strncmp("opacity",(char *)local_1240,7);
            if (iVar7 == 0) {
              AVar4 = pAVar15[7];
              if (((ulong)(byte)AVar4 < 0x21) &&
                 ((0x100003601U >> ((ulong)(byte)AVar4 & 0x3f) & 1) != 0)) {
                pAVar16 = pAVar15 + 7;
                local_1240 = pAVar15 + 8;
                if (AVar4 == (Assimp)0x0) {
                  local_1240 = pAVar16;
                }
                for (; (*local_1240 == (Assimp)0x20 || (*local_1240 == (Assimp)0x9));
                    local_1240 = local_1240 + 1) {
                }
                if ((0xd < (byte)*local_1240) ||
                   (pAVar16 = (Assimp *)0x3401, (0x3401U >> ((byte)*local_1240 & 0x1f) & 1) == 0)) {
                  local_1240 = (Assimp *)
                               fast_atoreal_move<float>
                                         (local_1240,(char *)local_11c0,(float *)0x1,
                                          SUB81(pAVar16,0));
                }
              }
            }
            goto LAB_0049b19d;
          }
          AVar4 = pAVar16[7];
          if ((0x20 < (ulong)(byte)AVar4) ||
             ((0x100003601U >> ((ulong)(byte)AVar4 & 0x3f) & 1) == 0)) goto LAB_0049b345;
          pAVar14 = pAVar16 + 7;
          pAVar16 = pAVar16 + 8;
          if (AVar4 == (Assimp)0x0) {
            pAVar16 = pAVar14;
          }
LAB_0049b6bf:
          uVar12 = SUB81(pAVar14,0);
          for (; (*pAVar16 == (Assimp)0x20 || (*pAVar16 == (Assimp)0x9)); pAVar16 = pAVar16 + 1) {
          }
          if ((byte)*pAVar16 < 0xe) {
            uVar12 = true;
            uVar11 = 1;
            if ((0x3401U >> ((byte)*pAVar16 & 0x1f) & 1) == 0) goto LAB_0049b8f8;
          }
          else {
LAB_0049b8f8:
            local_1240 = pAVar16;
            pAVar16 = (Assimp *)
                      fast_atoreal_move<float>(pAVar16,local_11b0,(float *)0x1,(bool)uVar12);
            uVar11 = uVar12;
          }
          for (; (*pAVar16 == (Assimp)0x20 || (*pAVar16 == (Assimp)0x9)); pAVar16 = pAVar16 + 1) {
          }
          if ((byte)*pAVar16 < 0xe) {
            uVar11 = true;
            uVar12 = 1;
            if ((0x3401U >> ((byte)*pAVar16 & 0x1f) & 1) == 0) goto LAB_0049b912;
          }
          else {
LAB_0049b912:
            local_1240 = pAVar16;
            pAVar16 = (Assimp *)
                      fast_atoreal_move<float>(pAVar16,local_11b0 + 4,(float *)0x1,(bool)uVar11);
            uVar12 = uVar11;
          }
          for (; (*pAVar16 == (Assimp)0x20 || (*pAVar16 == (Assimp)0x9)); pAVar16 = pAVar16 + 1) {
          }
          local_1240 = pAVar16;
          if ((0xd < (byte)*pAVar16) ||
             (uVar12 = true, (0x3401U >> ((byte)*pAVar16 & 0x1f) & 1) == 0)) {
            local_1240 = (Assimp *)
                         fast_atoreal_move<float>(pAVar16,local_11b0 + 8,(float *)0x1,(bool)uVar12);
          }
          (local_1230->ambient).r = (ai_real)local_11b0._0_4_;
          (local_1230->ambient).g = (ai_real)local_11b0._4_4_;
          (local_1230->ambient).b = (ai_real)local_11b0._8_4_;
          (local_1230->diffuse).r = (ai_real)local_11b0._0_4_;
          (local_1230->diffuse).g = (ai_real)local_11b0._4_4_;
          (local_1230->diffuse).b = (ai_real)local_11b0._8_4_;
        }
      } while( true );
    }
    pLVar9 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[36]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1038,
               (char (*) [36])"NFF2: Not a valid material library ");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1038,(path->_M_dataplus)._M_p,path->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1038,".",1);
    std::__cxx11::stringbuf::str();
    Logger::error(pLVar9,(char *)local_11b0._0_8_);
    if ((undefined1 *)local_11b0._0_8_ != local_11b0 + 0x10) {
      operator_delete((void *)local_11b0._0_8_,local_11b0._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1038);
    std::ios_base::~ios_base(local_fc8);
LAB_0049be38:
    if ((byte *)local_1200.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start == (byte *)0x0) goto LAB_0049bebd;
    uVar17 = (long)local_1200.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage -
             (long)local_1200.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  }
  operator_delete(local_1200.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,uVar17);
LAB_0049bebd:
  if (stream != (IOStream *)0x0) {
    (*stream->_vptr_IOStream[1])(stream);
  }
  return;
LAB_0049bbaf:
  local_1240 = (Assimp *)(local_1038 + (lVar18 - (ulong)(bVar2 == 0)) + 7);
  local_11b0._0_8_ = (byte *)0x3f19999a3f19999a;
  local_11b0._8_8_ = 0x3f8000003f19999a;
  local_11b0._16_8_ = 0x3f8000003f800000;
  local_11b0._24_8_ = 0x3f8000003f800000;
  local_1190 = 1.0;
  local_117c._0_4_ = 0.0;
  local_117c._4_4_ = 0.0;
  local_118c._0_4_ = 0.0;
  local_118c._4_4_ = 0.0;
  local_118c._8_4_ = 0.0;
  local_118c._12_4_ = 0.0;
  local_1174 = 1.0;
  local_1170._M_p = (pointer)&local_1160;
  local_1168 = 0;
  local_1160._M_local_buf[0] = '\0';
  local_1150._0_1_ = false;
  local_1150._1_1_ = true;
  local_114c._0_4_ = 1.0;
  local_114c._4_4_ = 0.0;
  local_1138 = 0;
  local_1130._M_local_buf[0] = '\0';
  local_1120 = aiTextureMapping_UV;
  local_1140._M_p = (pointer)&local_1130;
  std::vector<Assimp::NFFImporter::ShadingInfo,_std::allocator<Assimp::NFFImporter::ShadingInfo>_>::
  emplace_back<Assimp::NFFImporter::ShadingInfo>(local_11c8,(ShadingInfo *)local_11b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1140._M_p != &local_1130) {
    operator_delete(local_1140._M_p,
                    CONCAT71(local_1130._M_allocated_capacity._1_7_,local_1130._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1170._M_p != &local_1160) {
    operator_delete(local_1170._M_p,
                    CONCAT71(local_1160._M_allocated_capacity._1_7_,local_1160._M_local_buf[0]) + 1)
    ;
  }
  local_1230 = (pvVar6->
               super__Vector_base<Assimp::NFFImporter::ShadingInfo,_std::allocator<Assimp::NFFImporter::ShadingInfo>_>
               )._M_impl.super__Vector_impl_data._M_finish + -1;
  goto LAB_0049b180;
}

Assistant:

void NFFImporter::LoadNFF2MaterialTable(std::vector<ShadingInfo>& output,
    const std::string& path, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( path, "rb"));

    // Check whether we can read from the file
    if( !file.get())    {
        ASSIMP_LOG_ERROR("NFF2: Unable to open material library " + path + ".");
        return;
    }

    // get the size of the file
    const unsigned int m = (unsigned int)file->FileSize();

    // allocate storage and copy the contents of the file to a memory buffer
    // (terminate it with zero)
    std::vector<char> mBuffer2(m+1);
    TextFileToBuffer(file.get(),mBuffer2);
    const char* buffer = &mBuffer2[0];

    // First of all: remove all comments from the file
    CommentRemover::RemoveLineComments("//",&mBuffer2[0]);

    // The file should start with the magic sequence "mat"
    if (!TokenMatch(buffer,"mat",3))    {
        ASSIMP_LOG_ERROR_F("NFF2: Not a valid material library ", path, ".");
        return;
    }

    ShadingInfo* curShader = NULL;

    // No read the file line per line
    char line[4096];
    const char* sz;
    while (GetNextLine(buffer,line))
    {
        SkipSpaces(line,&sz);

        // 'version' defines the version of the file format
        if (TokenMatch(sz,"version",7))
        {
            ASSIMP_LOG_INFO_F("NFF (Sense8) material library file format: ", std::string(sz));
        }
        // 'matdef' starts a new material in the file
        else if (TokenMatch(sz,"matdef",6))
        {
            // add a new material to the list
            output.push_back( ShadingInfo() );
            curShader = & output.back();

            // parse the name of the material
        }
        else if (!TokenMatch(sz,"valid",5))
        {
            // check whether we have an active material at the moment
            if (!IsLineEnd(*sz))
            {
                if (!curShader)
                {
                    ASSIMP_LOG_ERROR_F("NFF2 material library: Found element ", sz, "but there is no active material");
                    continue;
                }
            }
            else continue;

            // now read the material property and determine its type
            aiColor3D c;
            if (TokenMatch(sz,"ambient",7))
            {
                AI_NFF_PARSE_TRIPLE(c);
                curShader->ambient = c;
            }
            else if (TokenMatch(sz,"diffuse",7) || TokenMatch(sz,"ambientdiffuse",14) /* correct? */)
            {
                AI_NFF_PARSE_TRIPLE(c);
                curShader->diffuse = curShader->ambient = c;
            }
            else if (TokenMatch(sz,"specular",8))
            {
                AI_NFF_PARSE_TRIPLE(c);
                curShader->specular = c;
            }
            else if (TokenMatch(sz,"emission",8))
            {
                AI_NFF_PARSE_TRIPLE(c);
                curShader->emissive = c;
            }
            else if (TokenMatch(sz,"shininess",9))
            {
                AI_NFF_PARSE_FLOAT(curShader->shininess);
            }
            else if (TokenMatch(sz,"opacity",7))
            {
                AI_NFF_PARSE_FLOAT(curShader->opacity);
            }
        }
    }
}